

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O0

Node * __thiscall AvlTree::containsElement(AvlTree *this,int value,Node *node)

{
  Node *node_local;
  int value_local;
  AvlTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (AvlTree *)0x0;
  }
  else if (value < node->value) {
    this_local = (AvlTree *)containsElement(this,value,node->leftChild);
  }
  else {
    this_local = (AvlTree *)node;
    if (node->value < value) {
      this_local = (AvlTree *)containsElement(this,value,node->rightChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

AvlTree::Node *AvlTree::containsElement(int value, Node *node) {
    if (node == nullptr) { // Element not found
        return nullptr;
    } else if (value < node->value) { // Searching for element
        return containsElement(value, node->leftChild);
    } else if (value > node->value) {
        return containsElement(value, node->rightChild);
    } else { // Element found
        return node;
    }
}